

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

int __thiscall
ON_PolyCurve::GetNurbForm(ON_PolyCurve *this,ON_NurbsCurve *nurb,double tol,ON_Interval *subdomain)

{
  ulong uVar1;
  uint uVar2;
  ON_Curve *pOVar3;
  _func_int *p_Var4;
  double *pdVar5;
  ON_3dPoint start_point;
  long lVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  double extraout_XMM0_Qa;
  double dVar16;
  double in_XMM1_Qa;
  ON_Interval domain;
  ON_3dPoint P;
  ON_NurbsCurve c;
  ON_3dPoint PEnd;
  ON_3dPoint PStart;
  ON_Interval local_f8;
  ON_Interval *local_e8;
  double local_e0;
  long local_d8;
  ON_3dPoint local_d0;
  ON_NurbsCurve local_b8;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  local_e0 = tol;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  local_f8.m_t[0] = extraout_XMM0_Qa;
  local_f8.m_t[1] = in_XMM1_Qa;
  bVar7 = ON_Interval::IsIncreasing(&local_f8);
  if (!bVar7) {
    return 0;
  }
  uVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (subdomain != (ON_Interval *)0x0) {
    bVar7 = ON_Interval::IsIncreasing(subdomain);
    if (!bVar7) {
      return 0;
    }
    dVar16 = ON_Interval::Min(subdomain);
    bVar7 = ON_Interval::Includes(&local_f8,dVar16,false);
    if (!bVar7) {
      return 0;
    }
    dVar16 = ON_Interval::Max(subdomain);
    bVar7 = ON_Interval::Includes(&local_f8,dVar16,false);
    if (!bVar7) {
      return 0;
    }
    local_f8.m_t[0] = subdomain->m_t[0];
    local_f8.m_t[1] = subdomain->m_t[1];
  }
  uVar10 = 0;
  uVar11 = 0;
  if (0 < (int)uVar2) {
    uVar10 = (ulong)uVar2;
  }
  do {
    if (uVar10 == uVar11) goto LAB_0059443c;
    uVar1 = uVar11 + 1;
    lVar6 = uVar11 + 1;
    uVar11 = uVar1;
  } while ((this->m_t).m_a[lVar6] <= local_f8.m_t[0]);
  uVar10 = (ulong)((int)uVar1 - 1);
LAB_0059443c:
  lVar13 = (long)(int)uVar10;
  iVar12 = uVar2 + 1;
  lVar6 = (long)(int)uVar2;
  do {
    lVar14 = lVar6;
    if (lVar14 <= lVar13) {
      return 0;
    }
    iVar12 = iVar12 + -1;
    lVar6 = lVar14 + -1;
  } while (local_f8.m_t[1] <= (this->m_t).m_a[lVar14 + -1]);
  iVar9 = 0;
  if (lVar13 < lVar14) {
    local_e8 = subdomain;
    ON_NurbsCurve::ON_NurbsCurve(&local_b8);
    local_d8 = 0;
    bVar7 = true;
    iVar8 = 0;
    do {
      pOVar3 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar13];
      if (pOVar3 == (ON_Curve *)0x0) {
        iVar9 = 0;
        break;
      }
      p_Var4 = (pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3f];
      bVar15 = local_d8 == 0;
      local_d8 = local_d8 + -1;
      if (bVar15) {
        iVar8 = (*p_Var4)(local_e0,pOVar3,nurb,0);
        iVar9 = iVar8;
        if (iVar8 < 1) break;
        pdVar5 = (this->m_t).m_a;
        (*(nurb->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                  (pdVar5[lVar13],pdVar5[lVar13 + 1]);
      }
      else {
        iVar9 = (*p_Var4)(local_e0,pOVar3,&local_b8,0);
        if (iVar9 < 1) break;
        if (iVar9 < iVar8) {
          iVar9 = iVar8;
        }
        iVar8 = iVar9;
        pdVar5 = (this->m_t).m_a;
        ON_NurbsCurve::SetDomain(&local_b8,pdVar5[lVar13],pdVar5[lVar13 + 1]);
        ON_Curve::PointAtEnd(&local_78,&nurb->super_ON_Curve);
        ON_Curve::PointAtStart(&local_48,&local_b8.super_ON_Curve);
        ON_3dPoint::operator+(&local_60,&local_78,&local_48);
        ::operator*(&local_d0,0.5,&local_60);
        (*(nurb->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])();
        start_point.y = local_d0.y;
        start_point.x = local_d0.x;
        start_point.z = local_d0.z;
        ON_NurbsCurve::SetStartPoint(&local_b8,start_point);
        bVar15 = ON_NurbsCurve::Append(nurb,&local_b8);
        if ((!bVar15) || (ON_NurbsCurve::Destroy(&local_b8), !bVar15)) {
          iVar9 = 0;
          break;
        }
      }
      lVar13 = lVar13 + 1;
      bVar7 = (int)lVar13 < iVar12;
      iVar9 = iVar8;
    } while ((int)lVar13 < iVar12);
    ON_NurbsCurve::~ON_NurbsCurve(&local_b8);
    if ((local_e8 != (ON_Interval *)0x0) && (!bVar7)) {
      (*(nurb->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3c])
                (nurb,local_e8);
      iVar9 = iVar8;
    }
  }
  return iVar9;
}

Assistant:

int ON_PolyCurve::GetNurbForm( 
                              ON_NurbsCurve& nurb, 
                              double tol,
                              const ON_Interval* subdomain  // OPTIONAL subdomain of ON::ProxyCurve::Domain()
                              ) const
{
  ON_Interval domain = Domain();
  if ( !domain.IsIncreasing() )
    return false;
  int rc = 0;
  int si0 = 0;
  int si1 = Count();
  if ( subdomain ) {
    if ( !subdomain->IsIncreasing() )
      return 0;
    if ( !domain.Includes(subdomain->Min()) )
      return 0;
    if ( !domain.Includes(subdomain->Max()) )
      return 0;
    domain = *subdomain;
  }

  while ( si0 < si1 && m_t[si0+1] <= domain.m_t[0] )
    si0++;
  while ( si0 < si1 && m_t[si1-1] >= domain.m_t[1] )
    si1--;
  if ( si0 >= si1 )
    return 0;
  {
    ON_NurbsCurve c;
    int i, rci;
    for ( i = si0; i < si1; i++ ) {
      if ( !m_segment[i] )
        return 0;
      if ( i == si0 ) {
        rc = m_segment[i]->GetNurbForm( nurb, tol, nullptr );
        if ( rc < 1 )
          return rc;
        nurb.SetDomain( m_t[i], m_t[i+1] );
      }
      else {
        rci = m_segment[i]->GetNurbForm( c, tol, nullptr );
        if ( rci < 1 )
          return rci;
        else if ( rc < rci )
          rc = rci;
        c.SetDomain( m_t[i], m_t[i+1] );
        ON_3dPoint PEnd = nurb.PointAtEnd();
        ON_3dPoint PStart = c.PointAtStart();
        ON_3dPoint P = 0.5*(PEnd+PStart);
        nurb.SetEndPoint(P);
        c.SetStartPoint(P);
        if ( !nurb.Append( c ) )
          return 0;
        c.Destroy();
      }
    }
  }

  if ( subdomain )
    nurb.Trim( *subdomain );

  return rc;
}